

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_dump_data(stbi__write_context *s,int length,uchar *data)

{
  undefined1 local_21;
  uchar *puStack_20;
  uchar lengthbyte;
  uchar *data_local;
  stbi__write_context *psStack_10;
  int length_local;
  stbi__write_context *s_local;
  
  local_21 = (undefined1)length;
  puStack_20 = data;
  data_local._4_4_ = length;
  psStack_10 = s;
  if (length < 0x81) {
    (*s->func)(s->context,&local_21,1);
    (*psStack_10->func)(psStack_10->context,puStack_20,data_local._4_4_);
    return;
  }
  __assert_fail("length <= 128",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/RuiwenTang[P]TinyRender/third_party/stb_image_write.h"
                ,0x265,"void stbiw__write_dump_data(stbi__write_context *, int, unsigned char *)");
}

Assistant:

void stbiw__write_dump_data(stbi__write_context *s, int length,
                            unsigned char *data) {
  unsigned char lengthbyte = STBIW_UCHAR(length);
  STBIW_ASSERT(
      length <=
      128);  // inconsistent with spec but consistent with official code
  s->func(s->context, &lengthbyte, 1);
  s->func(s->context, data, length);
}